

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O0

void enet_peer_dispatch_incoming_reliable_commands(ENetPeer *peer,ENetChannel *channel)

{
  int iVar1;
  long in_RSI;
  ENetChannel *in_RDI;
  ENetPeer *unaff_retaddr;
  ENetIncomingCommand *incomingCommand;
  ENetListIterator currentCommand;
  undefined8 *local_18;
  
  for (local_18 = *(undefined8 **)(in_RSI + 0x30);
      ((local_18 != (undefined8 *)(in_RSI + 0x30) && (*(int *)((long)local_18 + 0x4c) == 0)) &&
      (*(short *)(local_18 + 2) == (short)(*(short *)(in_RSI + 0x26) + 1)));
      local_18 = (undefined8 *)*local_18) {
    *(undefined2 *)(in_RSI + 0x26) = *(undefined2 *)(local_18 + 2);
    if (*(int *)(local_18 + 9) != 0) {
      *(short *)(in_RSI + 0x26) =
           *(short *)(in_RSI + 0x26) + (short)*(undefined4 *)(local_18 + 9) + -1;
    }
  }
  if (local_18 != *(undefined8 **)(in_RSI + 0x30)) {
    *(undefined2 *)(in_RSI + 0x28) = 0;
    enet_list_move(&in_RDI[3].incomingUnreliableCommands.sentinel,*(void **)(in_RSI + 0x30),
                   (void *)local_18[1]);
    iVar1._0_2_ = in_RDI[4].outgoingReliableSequenceNumber;
    iVar1._2_2_ = in_RDI[4].outgoingUnreliableSequenceNumber;
    if (iVar1 == 0) {
      enet_list_insert((ENetListIterator)(*(long *)(in_RDI->reliableWindows + 5) + 0x48),in_RDI);
      in_RDI[4].outgoingReliableSequenceNumber = 1;
      in_RDI[4].outgoingUnreliableSequenceNumber = 0;
    }
    if (*(long *)(in_RSI + 0x40) != in_RSI + 0x40) {
      enet_peer_dispatch_incoming_unreliable_commands(unaff_retaddr,in_RDI);
    }
  }
  return;
}

Assistant:

void
enet_peer_dispatch_incoming_reliable_commands (ENetPeer * peer, ENetChannel * channel)
{
    ENetListIterator currentCommand;

    for (currentCommand = enet_list_begin (& channel -> incomingReliableCommands);
         currentCommand != enet_list_end (& channel -> incomingReliableCommands);
         currentCommand = enet_list_next (currentCommand))
    {
       ENetIncomingCommand * incomingCommand = (ENetIncomingCommand *) currentCommand;
         
       if (incomingCommand -> fragmentsRemaining > 0 ||
           incomingCommand -> reliableSequenceNumber != (enet_uint16) (channel -> incomingReliableSequenceNumber + 1))
         break;

       channel -> incomingReliableSequenceNumber = incomingCommand -> reliableSequenceNumber;

       if (incomingCommand -> fragmentCount > 0)
         channel -> incomingReliableSequenceNumber += incomingCommand -> fragmentCount - 1;
    } 

    if (currentCommand == enet_list_begin (& channel -> incomingReliableCommands))
      return;

    channel -> incomingUnreliableSequenceNumber = 0;

    enet_list_move (enet_list_end (& peer -> dispatchedCommands), enet_list_begin (& channel -> incomingReliableCommands), enet_list_previous (currentCommand));

    if (! peer -> needsDispatch)
    {
       enet_list_insert (enet_list_end (& peer -> host -> dispatchQueue), & peer -> dispatchList);

       peer -> needsDispatch = 1;
    }

    if (! enet_list_empty (& channel -> incomingUnreliableCommands))
       enet_peer_dispatch_incoming_unreliable_commands (peer, channel);
}